

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>::
Unser<AutoFile,std::vector<double,std::allocator<double>>>
          (VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter> *this,AutoFile *s,
          vector<double,_std::allocator<double>_> *v)

{
  iterator __position;
  pointer pbVar1;
  uint64_t uVar2;
  size_t in_RCX;
  ulong uVar3;
  uint64_t __n;
  long in_FS_OFFSET;
  double dVar4;
  uint64_t obj;
  uint64_t local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((FILE *)(s->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start != s->m_file) {
    (s->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)s->m_file;
  }
  uVar2 = ReadCompactSize<AutoFile>((AutoFile *)this,true);
  if (uVar2 != 0) {
    __n = 0;
    do {
      uVar3 = __n + 0x98968;
      __n = uVar2;
      if (uVar3 < uVar2) {
        __n = uVar3;
      }
      std::vector<double,_std::allocator<double>_>::reserve
                ((vector<double,_std::allocator<double>_> *)s,__n);
      while (__position._M_current =
                  (double *)
                  (s->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start,
            (ulong)((long)__position._M_current - (long)s->m_file >> 3) < __n) {
        if (__position._M_current ==
            (double *)
            (s->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<>
                    ((vector<double,_std::allocator<double>_> *)s,__position);
        }
        else {
          *__position._M_current = 0.0;
          (s->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)(__position._M_current + 1);
        }
        pbVar1 = (s->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
        AutoFile::read((AutoFile *)this,(int)&local_40,&DAT_00000008,in_RCX);
        dVar4 = DecodeDouble(local_40);
        *(double *)(pbVar1 + -8) = dVar4;
      }
    } while (uVar3 < uVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, V& v)
    {
        Formatter formatter;
        v.clear();
        size_t size = ReadCompactSize(s);
        size_t allocated = 0;
        while (allocated < size) {
            // For DoS prevention, do not blindly allocate as much as the stream claims to contain.
            // Instead, allocate in 5MiB batches, so that an attacker actually needs to provide
            // X MiB of data to make us allocate X+5 Mib.
            static_assert(sizeof(typename V::value_type) <= MAX_VECTOR_ALLOCATE, "Vector element size too large");
            allocated = std::min(size, allocated + MAX_VECTOR_ALLOCATE / sizeof(typename V::value_type));
            v.reserve(allocated);
            while (v.size() < allocated) {
                v.emplace_back();
                formatter.Unser(s, v.back());
            }
        }
    }